

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O2

void addLinkLibrary(cmMakefile *mf,string *target,string *lib,cmTargetLinkLibraryType llt)

{
  bool bVar1;
  cmTarget *this;
  cmGlobalGenerator *this_00;
  cmTarget *this_01;
  ostream *poVar2;
  char *pcVar3;
  string sStack_1c8;
  ostringstream e;
  
  this = cmMakefile::FindLocalNonAliasTarget(mf,target);
  if (this == (cmTarget *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar2 = std::operator<<((ostream *)&e,"Attempt to add link library \"");
    poVar2 = std::operator<<(poVar2,(string *)lib);
    poVar2 = std::operator<<(poVar2,"\" to target \"");
    poVar2 = std::operator<<(poVar2,(string *)target);
    std::operator<<(poVar2,"\" which is not built in this directory.");
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(mf,FATAL_ERROR,&sStack_1c8);
    std::__cxx11::string::~string((string *)&sStack_1c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  }
  else {
    this_00 = cmMakefile::GetGlobalGenerator(mf);
    this_01 = cmGlobalGenerator::FindTarget(this_00,lib,false);
    if ((this_01 != (cmTarget *)0x0) &&
       ((INTERFACE_LIBRARY < this_01->TargetTypeValue ||
        ((0x86U >> (this_01->TargetTypeValue & 0x1f) & 1) == 0)))) {
      bVar1 = cmTarget::IsExecutableWithExports(this_01);
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar2 = std::operator<<((ostream *)&e,"Target \"");
        poVar2 = std::operator<<(poVar2,(string *)lib);
        poVar2 = std::operator<<(poVar2,"\" of type ");
        pcVar3 = cmState::GetTargetTypeName(this_01->TargetTypeValue);
        poVar2 = std::operator<<(poVar2,pcVar3);
        poVar2 = std::operator<<(poVar2," may not be linked into another target.  ");
        poVar2 = std::operator<<(poVar2,"One may link only to STATIC or SHARED libraries, or ");
        std::operator<<(poVar2,"to executables with the ENABLE_EXPORTS property set.");
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(mf,FATAL_ERROR,&sStack_1c8);
        std::__cxx11::string::~string((string *)&sStack_1c8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      }
    }
    cmTarget::AddLinkLibrary(this,mf,lib,llt);
  }
  return;
}

Assistant:

static void addLinkLibrary(cmMakefile* mf, std::string const& target,
                           std::string const& lib, cmTargetLinkLibraryType llt)
{
  cmTarget* t = mf->FindLocalNonAliasTarget(target);
  if (!t) {
    std::ostringstream e;
    e << "Attempt to add link library \"" << lib << "\" to target \"" << target
      << "\" which is not built in this directory.";
    mf->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
  }

  cmTarget* tgt = mf->GetGlobalGenerator()->FindTarget(lib);
  if (tgt && (tgt->GetType() != cmStateEnums::STATIC_LIBRARY) &&
      (tgt->GetType() != cmStateEnums::SHARED_LIBRARY) &&
      (tgt->GetType() != cmStateEnums::INTERFACE_LIBRARY) &&
      !tgt->IsExecutableWithExports()) {
    std::ostringstream e;
    e << "Target \"" << lib << "\" of type "
      << cmState::GetTargetTypeName(tgt->GetType())
      << " may not be linked into another target.  "
      << "One may link only to STATIC or SHARED libraries, or "
      << "to executables with the ENABLE_EXPORTS property set.";
    mf->IssueMessage(cmake::FATAL_ERROR, e.str());
  }

  t->AddLinkLibrary(*mf, lib, llt);
}